

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

bool __thiscall table::updatecheck(table *this,UpdateStatement *stmt)

{
  char cVar1;
  ExprType EVar2;
  pointer ppcVar3;
  pointer pcVar4;
  Expr *pEVar5;
  column *pcVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  char *pcVar13;
  ostream *poVar14;
  undefined8 uVar15;
  pointer ppcVar16;
  long lVar17;
  column *pcVar18;
  string *psVar19;
  column *pcVar20;
  UpdateStatement *pUVar21;
  string colName;
  fstream os;
  char *local_298;
  size_t local_290;
  char local_288 [16];
  char *local_278;
  uint local_26c;
  UpdateStatement *local_268;
  table *local_260;
  ulong local_258;
  string *local_250;
  char *local_248;
  string local_240 [16];
  
  std::__cxx11::string::string
            ((string *)local_240,
             (*(stmt->updates->
               super__Vector_base<hsql::UpdateClause_*,_std::allocator<hsql::UpdateClause_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->column,(allocator *)&local_298);
  ppcVar16 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_268 = stmt;
  if (ppcVar16 == ppcVar3) {
    pcVar18 = (column *)0x0;
  }
  else {
    do {
      pcVar18 = *ppcVar16;
      bVar8 = util::compareString(&pcVar18->name,local_240);
      if (bVar8) goto LAB_0011b223;
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 != ppcVar3);
    pcVar18 = (column *)0x0;
  }
LAB_0011b223:
  pUVar21 = local_268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
    operator_delete(local_240[0]._M_dataplus._M_p);
  }
  if (pcVar18 == (column *)0x0) {
    pcVar13 = "no such column in table to update";
    lVar17 = 0x21;
  }
  else {
    if (pUVar21->where == (Expr *)0x0) {
      uVar11 = 0;
    }
    else {
      pcVar4 = (this->filename)._M_dataplus._M_p;
      local_298 = local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar4,pcVar4 + (this->filename)._M_string_length);
      std::fstream::fstream(local_240,(string *)&local_298,_S_out|_S_in|_S_bin);
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      local_258 = 0;
      if (this->rowlength < 1) {
        local_26c = 0;
      }
      else {
        psVar19 = &pcVar18->flag;
        local_26c = 0;
        local_260 = this;
        local_250 = psVar19;
        do {
          pEVar5 = pUVar21->where;
          if ((pEVar5->expr2->type == kExprLiteralInt) || (pEVar5->expr->type == kExprLiteralInt)) {
            local_298 = local_288;
            local_290 = 0;
            local_288[0] = '\0';
            EVar2 = pEVar5->expr2->type;
            if (EVar2 == kExprLiteralString) {
LAB_0011b2fd:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"cannot do compare between int and char",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              iVar9 = 1;
            }
            else {
              if (EVar2 == kExprLiteralInt) {
                if (pEVar5->expr->type == kExprLiteralString) goto LAB_0011b2fd;
                pcVar13 = pEVar5->expr->name;
                strlen(pcVar13);
                lVar17 = 0x10;
                std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)0x0,(ulong)pcVar13);
              }
              else {
                pcVar13 = pEVar5->expr2->name;
                strlen(pcVar13);
                lVar17 = 8;
                std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)0x0,(ulong)pcVar13);
              }
              sVar7 = local_290;
              local_278 = (char *)CONCAT44(local_278._4_4_,
                                           *(undefined4 *)
                                            (*(long *)((long)&pUVar21->where->type + lVar17) + 0x48)
                                          );
              ppcVar16 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              if (ppcVar16 == ppcVar3) {
                pcVar18 = (column *)0x0;
              }
              else {
                local_248 = local_298;
                pcVar20 = (column *)0x0;
                do {
                  pcVar6 = *ppcVar16;
                  bVar8 = sVar7 != (pcVar6->name)._M_string_length;
                  pcVar18 = pcVar6;
                  if (bVar8) {
                    pcVar18 = pcVar20;
                  }
                  if ((!bVar8 && sVar7 != 0) &&
                     (iVar9 = bcmp(local_248,(pcVar6->name)._M_dataplus._M_p,sVar7),
                     pcVar18 = pcVar20, iVar9 == 0)) {
                    pcVar18 = pcVar6;
                  }
                  ppcVar16 = ppcVar16 + 1;
                  pcVar20 = pcVar18;
                } while (ppcVar16 != ppcVar3);
              }
              this = local_260;
              if (pcVar18 == (column *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"column ",7);
                this = local_260;
                pUVar21 = local_268;
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_298,local_290);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," do not exist in table",0x16);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                iVar9 = 1;
                std::ostream::flush();
              }
              else {
                std::istream::seekg(local_240,
                                    (long)pcVar18->col_offset +
                                    (long)(int)local_258 * (long)local_260->rowSize,0);
                pUVar21 = local_268;
                iVar9 = pcVar18->element_truesize;
                if (iVar9 < 0) {
                  iVar9 = -1;
                }
                piVar12 = (int *)operator_new__((long)iVar9);
                std::istream::read((char *)local_240,(long)piVar12);
                if (pUVar21->where->opChar == '=') {
                  iVar9 = std::__cxx11::string::compare((char *)&pcVar18->flag);
                  pcVar13 = "cannot do = for char columns with int value";
                  if (iVar9 == 0) {
LAB_0011b5a6:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar13,0x2b);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                    std::ostream::put('p');
                    iVar10 = 1;
                    std::ostream::flush();
                  }
                  else {
                    iVar10 = 4;
                    if (*piVar12 == (int)local_278) goto LAB_0011b4a3;
                  }
LAB_0011b5ee:
                  operator_delete(piVar12);
                  iVar9 = iVar10;
                }
                else {
LAB_0011b4a3:
                  if (pUVar21->where->opChar == '>') {
                    iVar9 = std::__cxx11::string::compare((char *)&pcVar18->flag);
                    pcVar13 = "cannot do > for char columns with int value";
                    if (iVar9 == 0) goto LAB_0011b5a6;
                    iVar10 = 4;
                    if (*piVar12 <= (int)local_278) goto LAB_0011b5ee;
                  }
                  iVar9 = 0;
                  if (pUVar21->where->opChar == '<') {
                    iVar10 = std::__cxx11::string::compare((char *)&pcVar18->flag);
                    pcVar13 = "cannot do < for char columns with int value";
                    if (iVar10 == 0) goto LAB_0011b5a6;
                    iVar10 = 4;
                    if ((int)local_278 <= *piVar12) goto LAB_0011b5ee;
                  }
                }
              }
            }
            if (local_298 != local_288) {
              operator_delete(local_298);
            }
            psVar19 = local_250;
            if (iVar9 == 0) goto LAB_0011b61a;
LAB_0011b89a:
            if (iVar9 != 4) goto LAB_0011b8f6;
          }
          else {
LAB_0011b61a:
            pEVar5 = pUVar21->where;
            EVar2 = pEVar5->expr->type;
            if ((EVar2 != kExprColumnRef) || (pEVar5->expr2->type != kExprColumnRef)) {
              if ((EVar2 == kExprLiteralString) || (pEVar5->expr2->type == kExprLiteralString)) {
                local_298 = local_288;
                local_290 = 0;
                local_288[0] = '\0';
                if (pEVar5->expr2->type == kExprLiteralString) {
                  pcVar13 = pEVar5->expr->name;
                  strlen(pcVar13);
                  lVar17 = 0x10;
                  std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)0x0,(ulong)pcVar13);
                }
                else {
                  pcVar13 = pEVar5->expr2->name;
                  strlen(pcVar13);
                  lVar17 = 8;
                  std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)0x0,(ulong)pcVar13);
                }
                sVar7 = local_290;
                local_278 = *(char **)(*(long *)((long)&pUVar21->where->type + lVar17) + 0x28);
                ppcVar16 = (this->table_cols).
                           super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (ppcVar16 == ppcVar3) {
                  pcVar18 = (column *)0x0;
                }
                else {
                  local_248 = local_298;
                  pcVar20 = (column *)0x0;
                  do {
                    pcVar6 = *ppcVar16;
                    bVar8 = sVar7 != (pcVar6->name)._M_string_length;
                    pcVar18 = pcVar6;
                    if (bVar8) {
                      pcVar18 = pcVar20;
                    }
                    if ((!bVar8 && sVar7 != 0) &&
                       (iVar9 = bcmp(local_248,(pcVar6->name)._M_dataplus._M_p,sVar7),
                       pcVar18 = pcVar20, iVar9 == 0)) {
                      pcVar18 = pcVar6;
                    }
                    ppcVar16 = ppcVar16 + 1;
                    pcVar20 = pcVar18;
                  } while (ppcVar16 != ppcVar3);
                }
                if (pcVar18 == (column *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"column ",7);
                  psVar19 = local_250;
                  pUVar21 = local_268;
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_298,local_290);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," do not exist in table",0x16);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                  std::ostream::put((char)poVar14);
                  iVar9 = 1;
                  std::ostream::flush();
                }
                else {
                  std::istream::seekg(local_240,
                                      (long)pcVar18->col_offset +
                                      (long)(int)local_258 * (long)local_260->rowSize,0);
                  psVar19 = local_250;
                  pUVar21 = local_268;
                  iVar9 = pcVar18->element_truesize;
                  if (iVar9 < 0) {
                    iVar9 = -1;
                  }
                  pcVar13 = (char *)operator_new__((long)iVar9);
                  std::istream::read((char *)local_240,(long)pcVar13);
                  cVar1 = pUVar21->where->opChar;
                  iVar9 = 0;
                  if (cVar1 == '<') {
                    iVar10 = util::compareChar(pcVar13,local_278);
                    iVar9 = 0;
                    if (iVar10 != -1) goto LAB_0011b86f;
                  }
                  else if (cVar1 == '>') {
                    iVar10 = util::compareChar(pcVar13,local_278);
                    if (iVar10 != 1) goto LAB_0011b86f;
                  }
                  else if ((cVar1 == '=') &&
                          (bVar8 = util::compareString(pcVar13,local_278), !bVar8)) {
LAB_0011b86f:
                    operator_delete(pcVar13);
                    iVar9 = 4;
                  }
                }
                if (local_298 != local_288) {
                  operator_delete(local_298);
                }
                this = local_260;
                if (iVar9 != 0) goto LAB_0011b89a;
              }
              uVar15 = std::__cxx11::string::compare((char *)psVar19);
              local_26c = (uint)CONCAT71((int7)((ulong)uVar15 >> 8),1);
            }
          }
          uVar11 = (int)local_258 + 1;
          local_258 = (ulong)uVar11;
        } while ((int)uVar11 < this->rowlength);
      }
      iVar9 = 2;
LAB_0011b8f6:
      if (iVar9 == 2) {
        iVar9 = 0;
        std::fstream::close();
      }
      std::fstream::~fstream(local_240);
      uVar11 = local_26c;
      if (iVar9 != 0) {
        return false;
      }
    }
    if ((uVar11 & 1) != 0) {
      return true;
    }
    pcVar13 = "where condition is wrong";
    lVar17 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return false;
}

Assistant:

bool table::updatecheck(hsql::UpdateStatement *stmt) {
    column* col = getColumn((*stmt->updates)[0]->column);
    bool updated = false;
    if(col == NULL){
        cout << "no such column in table to update" <<endl;
        return false;
    }
    if(stmt->where == nullptr){
        //set all column to same value
    }
    else {
        fstream os(getName(), ios::in|ios::out|ios::binary);

        for (int i = 0; i < getRowlength(); i++) {
            if (stmt->where->expr2->type == hsql::kExprLiteralInt || stmt->where->expr->type == hsql::kExprLiteralInt) {
                //select column
                string colName;
                int compareNum;
                if (stmt->where->expr2->type == hsql::kExprLiteralInt) {
                    if (stmt->where->expr->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr->name;
                    compareNum = (int) stmt->where->expr2->ival;
                } else {
                    if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr2->name;
                    compareNum = (int) stmt->where->expr->ival;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do = for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if (stmt->where->opChar == '>') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do > for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes <= compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if (stmt->where->opChar == '<') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do < for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes >= compareNum) {
                        delete bytes;
                        continue;
                    }
                }

            }
            if (stmt->where->expr->type == hsql::kExprColumnRef && stmt->where->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if (stmt->where->expr2->type == hsql::kExprLiteralString ||
                stmt->where->expr->type == hsql::kExprLiteralString) {
                //select column
                string colName;
                char *compareChar;
                if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->where->expr->name;
                    compareChar = stmt->where->expr2->name;
                } else {
                    colName = stmt->where->expr2->name;
                    compareChar = stmt->where->expr->name;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (!util::compareString(bytes, compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if (stmt->where->opChar == '>') {
                    if (util::compareChar(bytes, compareChar) != 1) {
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if (stmt->where->opChar == '<') {
                    if (util::compareChar(bytes, compareChar) != -1) {
                        delete bytes;
                        continue;
                    }
                }

            }
            //do update

            if (col != NULL) {

                if (col->flag == "CHAR") {
                    if (((*stmt->updates)[0]->value)->type == hsql::kExprLiteralString) {

                        updated = true;

                    } else {

                        updated = true;
                    }
                } else {

                    updated = true;

                }
            }

        }
        os.close();
    }
    if(updated)
        return true;
    else{
        cout<<"where condition is wrong"<<endl;
        return false;
    }

}